

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall
GlobOpt::ChangeValueType
          (GlobOpt *this,BasicBlock *block,Value *value,ValueType newValueType,
          bool preserveSubclassInfo,bool allowIncompatibleType)

{
  Sym *pSVar1;
  code *pcVar2;
  bool bVar3;
  ObjectType OVar4;
  ObjectType OVar5;
  undefined4 *puVar6;
  ValueInfo *pVVar7;
  undefined7 in_register_00000089;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  undefined4 local_38;
  ValueType valueType;
  ValueType newValueType_local;
  
  local_38 = (undefined4)CONCAT71(in_register_00000089,allowIncompatibleType);
  valueType.field_0 = newValueType.field_0;
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3178,"(value)","value");
    if (!bVar3) goto LAB_0044d7d3;
    *puVar6 = 0;
  }
  bVar3 = ValueInfo::IsJsType(value->valueInfo);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x317a,"(!value->GetValueInfo()->IsJsType())",
                       "!value->GetValueInfo()->IsJsType()");
    if (!bVar3) goto LAB_0044d7d3;
    *puVar6 = 0;
  }
  pVVar7 = value->valueInfo;
  local_3a = (pVVar7->super_ValueType).field_0;
  bVar3 = ValueType::operator==((ValueType *)&local_3a.field_0,newValueType);
  if (bVar3) {
    if (preserveSubclassInfo) {
      return;
    }
    bVar3 = ValueInfo::IsGeneric(pVVar7);
    if (bVar3) {
      return;
    }
  }
  else if ((preserveSubclassInfo) && (bVar3 = ValueInfo::IsArrayValueInfo(pVVar7), bVar3)) {
    bVar3 = ValueType::IsObject(&valueType);
    if (bVar3) {
      OVar4 = ValueType::GetObjectType(&valueType);
      OVar5 = ValueType::GetObjectType(&pVVar7->super_ValueType);
      if (OVar4 == OVar5) goto LAB_0044d720;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3187,
                       "(!preserveSubclassInfo || !valueInfo->IsArrayValueInfo() || newValueType.IsObject() && newValueType.GetObjectType() == valueInfo->GetObjectType())"
                       ,
                       "!preserveSubclassInfo || !valueInfo->IsArrayValueInfo() || newValueType.IsObject() && newValueType.GetObjectType() == valueInfo->GetObjectType()"
                      );
    if (!bVar3) goto LAB_0044d7d3;
    *puVar6 = 0;
  }
LAB_0044d720:
  pSVar1 = pVVar7->symStore;
  if (((pSVar1 != (Sym *)0x0) && (pSVar1->m_kind == SymKindStack)) &&
     (((ulong)pSVar1[1]._vptr_Sym & 0x40000) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3189,
                       "(!valueInfo->GetSymStore() || !valueInfo->GetSymStore()->IsStackSym() || !valueInfo->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable())"
                       ,
                       "!valueInfo->GetSymStore() || !valueInfo->GetSymStore()->IsStackSym() || !valueInfo->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable()"
                      );
    if (!bVar3) {
LAB_0044d7d3:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (preserveSubclassInfo) {
    pVVar7 = ValueInfo::Copy(pVVar7,this->alloc);
  }
  else {
    pVVar7 = ValueInfo::CopyWithGenericStructureKind(pVVar7,this->alloc);
  }
  (pVVar7->super_ValueType).field_0.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)valueType.field_0;
  ChangeValueInfo(this,block,value,pVVar7,local_38._0_1_,false);
  return;
}

Assistant:

void
GlobOpt::ChangeValueType(
    BasicBlock *const block,
    Value *const value,
    const ValueType newValueType,
    const bool preserveSubclassInfo,
    const bool allowIncompatibleType) const
{
    Assert(value);
    // Why are we trying to change the value type of the type sym value? Asserting here to make sure we don't deep copy the type sym's value info.
    Assert(!value->GetValueInfo()->IsJsType());

    ValueInfo *const valueInfo = value->GetValueInfo();
    const ValueType valueType(valueInfo->Type());
    if(valueType == newValueType && (preserveSubclassInfo || valueInfo->IsGeneric()))
    {
        return;
    }

    // ArrayValueInfo has information specific to the array type, so make sure that doesn't change
    Assert(
        !preserveSubclassInfo ||
        !valueInfo->IsArrayValueInfo() ||
        newValueType.IsObject() && newValueType.GetObjectType() == valueInfo->GetObjectType());

    Assert(!valueInfo->GetSymStore() || !valueInfo->GetSymStore()->IsStackSym() || !valueInfo->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable());

    ValueInfo *const newValueInfo =
        preserveSubclassInfo
            ? valueInfo->Copy(alloc)
            : valueInfo->CopyWithGenericStructureKind(alloc);
    newValueInfo->Type() = newValueType;
    ChangeValueInfo(block, value, newValueInfo, allowIncompatibleType);
}